

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

optional<pbrt::LightLiSample> * __thiscall
pbrt::GoniometricLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,GoniometricLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar10 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [56];
  undefined1 auVar28 [16];
  Vector3f wl;
  SampledSpectrum SVar29;
  undefined1 auVar18 [56];
  undefined1 auVar26 [64];
  
  auVar21 = ZEXT816(0) << 0x40;
  auVar10 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][1]),0x10);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0)),
                           auVar21,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]))
  ;
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0))
                            ,auVar21,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]
                                            ));
  auVar5 = vfmadd231ss_fma(auVar5,auVar21,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  auVar14 = vfmadd231ss_fma(auVar14,auVar21,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  auVar21._0_4_ = auVar10._0_4_ * 0.0;
  auVar21._4_4_ = auVar10._4_4_ * 0.0;
  auVar21._8_4_ = auVar10._8_4_ * 0.0;
  auVar21._12_4_ = auVar10._12_4_ * 0.0;
  fVar3 = auVar14._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  fVar4 = auVar5._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  bVar2 = fVar3 == 1.0;
  uVar6 = 0xff;
  if (!bVar2) {
    uVar6 = 0;
  }
  uVar7 = (ulong)uVar6;
  if (NAN(fVar3)) {
    uVar7 = 0;
  }
  fVar8 = (float)((uint)bVar2 * (int)fVar4 + (uint)!bVar2 * (int)(fVar4 / fVar3));
  auVar10 = vinsertps_avx((undefined1  [16])(this->super_LightBase).renderFromLight.m.m[0],
                          ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]),0x10);
  auVar5 = vfmadd213ps_fma(auVar10,ZEXT816(0) << 0x40,auVar21);
  auVar10 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 2)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]),0x10);
  auVar5 = vfmadd213ps_fma(auVar10,ZEXT816(0) << 0x40,auVar5);
  auVar10 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 3)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][3]),0x10);
  auVar14._0_4_ = auVar10._0_4_ + auVar5._0_4_;
  auVar14._4_4_ = auVar10._4_4_ + auVar5._4_4_;
  auVar14._8_4_ = auVar10._8_4_ + auVar5._8_4_;
  auVar14._12_4_ = auVar10._12_4_ + auVar5._12_4_;
  auVar22._4_4_ = fVar3;
  auVar22._0_4_ = fVar3;
  auVar22._8_4_ = fVar3;
  auVar22._12_4_ = fVar3;
  auVar10 = vdivps_avx(auVar14,auVar22);
  auVar5 = vinsertps_avx(ctx.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                         ZEXT416((uint)ctx.pi.super_Point3<pbrt::Interval>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  bVar2 = (bool)((byte)uVar7 & 1);
  fVar9 = (float)((uint)bVar2 * (int)auVar14._0_4_ | (uint)!bVar2 * auVar10._0_4_);
  bVar2 = (bool)((byte)(uVar7 >> 1) & 1);
  fVar11 = (float)((uint)bVar2 * (int)auVar14._4_4_ | (uint)!bVar2 * auVar10._4_4_);
  bVar2 = (bool)((byte)(uVar7 >> 2) & 1);
  fVar12 = (float)((uint)bVar2 * (int)auVar14._8_4_ | (uint)!bVar2 * auVar10._8_4_);
  bVar2 = (bool)((byte)(uVar7 >> 3) & 1);
  fVar13 = (float)((uint)bVar2 * (int)auVar14._12_4_ | (uint)!bVar2 * auVar10._12_4_);
  auVar15._0_4_ =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high +
       auVar5._0_4_;
  auVar15._4_4_ =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
       auVar5._4_4_;
  auVar15._8_4_ = auVar5._8_4_ + 0.0;
  auVar15._12_4_ = auVar5._12_4_ + 0.0;
  auVar10._8_4_ = 0xbf000000;
  auVar10._0_8_ = 0xbf000000bf000000;
  auVar10._12_4_ = 0xbf000000;
  auVar10 = vmulps_avx512vl(auVar15,auVar10);
  auVar16._0_4_ = fVar9 + auVar10._0_4_;
  auVar16._4_4_ = fVar11 + auVar10._4_4_;
  auVar16._8_4_ = fVar12 + auVar10._8_4_;
  auVar16._12_4_ = fVar13 + auVar10._12_4_;
  fVar3 = fVar8 + (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                   low + ctx.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * -0.5;
  auVar23._0_4_ = auVar16._0_4_ * auVar16._0_4_;
  auVar23._4_4_ = auVar16._4_4_ * auVar16._4_4_;
  auVar23._8_4_ = auVar16._8_4_ * auVar16._8_4_;
  auVar23._12_4_ = auVar16._12_4_ * auVar16._12_4_;
  auVar10 = vhaddps_avx(auVar23,auVar23);
  fVar4 = auVar10._0_4_ + fVar3 * fVar3;
  auVar10 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
  fVar19 = auVar10._0_4_;
  auVar28._4_4_ = fVar19;
  auVar28._0_4_ = fVar19;
  auVar28._8_4_ = fVar19;
  auVar28._12_4_ = fVar19;
  auVar10 = vdivps_avx(auVar16,auVar28);
  auVar15 = ZEXT416((uint)(fVar3 / fVar19));
  auVar5 = vmovshdup_avx(auVar10);
  fVar20 = auVar5._0_4_;
  auVar5 = vfnmsub231ss_fma(ZEXT416((uint)(fVar20 * (this->super_LightBase).renderFromLight.mInv.m
                                                    [0][1])),auVar10,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar14 = vfnmsub231ss_fma(ZEXT416((uint)(fVar20 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [1][1])),auVar10,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar21 = vfnmsub231ss_fma(ZEXT416((uint)(fVar20 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [2][1])),auVar10,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar5 = vfnmadd231ss_fma(auVar5,auVar15,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar14 = vfnmadd231ss_fma(auVar14,auVar15,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar21 = vfnmadd231ss_fma(auVar21,auVar15,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  auVar5 = vinsertps_avx(auVar5,auVar14,0x10);
  wl.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar5._0_8_;
  wl.super_Tuple3<pbrt::Vector3,_float>.z = auVar21._0_4_;
  auVar27 = ZEXT856(auVar21._8_8_);
  auVar18 = ZEXT856(auVar5._8_8_);
  SVar29 = I(this,wl,&lambda);
  auVar26._0_8_ = SVar29.values.values._8_8_;
  auVar26._8_56_ = auVar27;
  auVar17._0_8_ = SVar29.values.values._0_8_;
  auVar17._8_56_ = auVar18;
  auVar5 = vmovlhps_avx(auVar17._0_16_,auVar26._0_16_);
  auVar24._4_4_ = fVar4;
  auVar24._0_4_ = fVar4;
  auVar24._8_4_ = fVar4;
  auVar24._12_4_ = fVar4;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  __return_storage_ptr__->set = true;
  auVar5 = vdivps_avx(auVar5,auVar24);
  auVar25._4_4_ = fVar8;
  auVar25._0_4_ = fVar8;
  auVar25._8_4_ = fVar8;
  auVar25._12_4_ = fVar8;
  *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar5;
  uVar1 = vmovlps_avx(auVar10);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
  auVar5._4_4_ = fVar11;
  auVar5._0_4_ = fVar9;
  auVar5._8_4_ = fVar12;
  auVar5._12_4_ = fVar13;
  auVar10 = vpermilps_avx(auVar5,0x50);
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar3 / fVar19;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3f800000;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar10;
  uVar1 = vmovlps_avx(auVar25);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar1;
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
       &(this->super_LightBase).mediumInterface;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLiSample> GoniometricLight::SampleLi(LightSampleContext ctx,
                                                         Point2f u,
                                                         SampledWavelengths lambda,
                                                         LightSamplingMode mode) const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f wi = Normalize(p - ctx.p());
    SampledSpectrum L =
        I(renderFromLight.ApplyInverse(-wi), lambda) / DistanceSquared(p, ctx.p());
    return LightLiSample(L, wi, 1, Interaction(p, &mediumInterface));
}